

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O0

void __thiscall miniros::master::RegistrationManager::RegistrationManager(RegistrationManager *this)

{
  long in_RDI;
  Registrations *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  Type TVar1;
  Registrations *in_stack_ffffffffffffffc0;
  
  TVar1 = (Type)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  Registrations::Registrations(in_stack_ffffffffffffffc0,TVar1);
  Registrations::Registrations(in_stack_ffffffffffffffc0,TVar1);
  Registrations::Registrations(in_stack_ffffffffffffffc0,TVar1);
  ::std::mutex::mutex((mutex *)0x543b0d);
  TVar1 = (Type)((ulong)(in_RDI + 0x160) >> 0x20);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
         *)0x543b22);
  this_00 = (Registrations *)(in_RDI + 400);
  ::std::
  set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  ::set((set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
         *)0x543b38);
  Registrations::Registrations(this_00,TVar1);
  return;
}

Assistant:

RegistrationManager::RegistrationManager()
  : publishers(Registrations::TOPIC_PUBLICATIONS)
  , subscribers(Registrations::TOPIC_SUBSCRIPTIONS)
  , services(Registrations::SERVICE)
  , param_subscribers(Registrations::PARAM_SUBSCRIPTIONS)
{
}